

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcCrossProductsPartials
          (BeagleCPUImpl<float,_1,_0> *this,float *postOrderPartial,float *preOrderPartial,
          double *categoryRates,float *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  pointer pfVar1;
  double *pdVar2;
  float fVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  float *pfVar18;
  pointer pfVar19;
  float *pfVar20;
  double *pdVar21;
  long lVar22;
  int j;
  ulong uVar23;
  ulong uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  vector<float,_std::allocator<float>_> tmp;
  allocator_type local_91;
  long local_90;
  value_type_conflict3 local_84;
  long local_80;
  float *local_78;
  BeagleCPUImpl<float,_1,_0> *local_70;
  double local_68;
  float *local_60;
  double *local_58;
  double *local_50;
  vector<float,_std::allocator<float>_> local_48;
  
  if (0 < this->kPatternCount) {
    local_80 = 0;
    local_90 = 0;
    local_78 = preOrderPartial;
    local_70 = this;
    local_68 = edgeLength;
    local_60 = postOrderPartial;
    local_58 = outCrossProducts;
    local_50 = categoryRates;
    do {
      local_84 = 0.0;
      std::vector<float,_std::allocator<float>_>::vector
                (&local_48,(ulong)(uint)(this->kStateCount * this->kStateCount),&local_84,&local_91)
      ;
      uVar4 = this->kStateCount;
      iVar5 = this->kCategoryCount;
      uVar15 = (ulong)uVar4;
      if ((long)iVar5 < 1) {
        auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        dVar31 = 0.0;
      }
      else {
        lVar17 = (long)this->kPartialsPaddedStateCount;
        iVar6 = this->kPatternCount;
        auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar33 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar16 = 0;
        lVar22 = iVar6 * lVar17;
        pfVar20 = (float *)((long)local_60 + local_80 * lVar17);
        pfVar18 = (float *)(local_80 * lVar17 + (long)local_78);
        do {
          fVar3 = categoryWeights[lVar16];
          if ((int)uVar4 < 1) {
            auVar30 = vfmadd231ss_fma(auVar33._0_16_,ZEXT816(0) << 0x40,ZEXT416((uint)fVar3));
            auVar33 = ZEXT1664(auVar30);
          }
          else {
            auVar30 = ZEXT816(0) << 0x40;
            uVar24 = 0;
            auVar32._0_4_ = (float)((double)(float)local_50[lVar16] * local_68);
            auVar32._4_4_ = (int)((ulong)((double)(float)local_50[lVar16] * local_68) >> 0x20);
            auVar32._8_8_ = 0;
            do {
              auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)pfVar20[uVar24]),
                                        ZEXT416((uint)pfVar18[uVar24]));
              uVar24 = uVar24 + 1;
            } while (uVar15 != uVar24);
            auVar30 = vfmadd231ss_fma(auVar33._0_16_,ZEXT416((uint)fVar3),auVar30);
            auVar33 = ZEXT1664(auVar30);
            if (0 < (int)uVar4) {
              uVar24 = 0;
              pfVar19 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                uVar23 = 0;
                do {
                  auVar30 = vfmadd213ss_fma(ZEXT416((uint)(fVar3 * local_78[(lVar16 * iVar6 +
                                                                            local_90) * lVar17 +
                                                                            uVar24] *
                                                                   pfVar20[uVar23])),auVar32,
                                            ZEXT416((uint)pfVar19[uVar23]));
                  pfVar19[uVar23] = auVar30._0_4_;
                  uVar23 = uVar23 + 1;
                } while (uVar15 != uVar23);
                uVar24 = uVar24 + 1;
                pfVar19 = pfVar19 + (int)uVar4;
              } while (uVar24 != uVar15);
            }
          }
          lVar16 = lVar16 + 1;
          pfVar20 = pfVar20 + lVar22;
          pfVar18 = pfVar18 + lVar22;
        } while (lVar16 != iVar5);
        dVar31 = (double)auVar33._0_4_;
        this = local_70;
      }
      if ((int)uVar4 < 1) {
        if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_0013ae95;
      }
      else {
        uVar24 = 0;
        auVar33 = vpbroadcastq_avx512f();
        auVar30._0_8_ = this->gPatternWeights[local_90] / dVar31;
        auVar30._8_8_ = 0;
        auVar27 = vbroadcastsd_avx512f(auVar30);
        pfVar19 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar21 = local_58;
        do {
          uVar23 = 0;
          do {
            auVar28 = vpbroadcastq_avx512f();
            auVar28 = vporq_avx512f(auVar28,auVar26);
            uVar14 = vpcmpuq_avx512f(auVar28,auVar33,2);
            pfVar1 = pfVar19 + uVar23;
            bVar7 = (byte)uVar14;
            auVar25._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * (int)pfVar1[1];
            auVar25._0_4_ = (uint)(bVar7 & 1) * (int)*pfVar1;
            auVar25._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * (int)pfVar1[2];
            auVar25._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * (int)pfVar1[3];
            auVar25._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * (int)pfVar1[4];
            auVar25._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * (int)pfVar1[5];
            auVar25._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * (int)pfVar1[6];
            auVar25._28_4_ = (uint)(byte)(uVar14 >> 7) * (int)pfVar1[7];
            pdVar2 = pdVar21 + uVar23;
            auVar28._8_8_ = (ulong)((byte)(uVar14 >> 1) & 1) * (long)pdVar2[1];
            auVar28._0_8_ = (ulong)(bVar7 & 1) * (long)*pdVar2;
            auVar28._16_8_ = (ulong)((byte)(uVar14 >> 2) & 1) * (long)pdVar2[2];
            auVar28._24_8_ = (ulong)((byte)(uVar14 >> 3) & 1) * (long)pdVar2[3];
            auVar28._32_8_ = (ulong)((byte)(uVar14 >> 4) & 1) * (long)pdVar2[4];
            auVar28._40_8_ = (ulong)((byte)(uVar14 >> 5) & 1) * (long)pdVar2[5];
            auVar28._48_8_ = (ulong)((byte)(uVar14 >> 6) & 1) * (long)pdVar2[6];
            auVar28._56_8_ = (uVar14 >> 7) * (long)pdVar2[7];
            auVar29 = vcvtps2pd_avx512f(auVar25);
            auVar28 = vfmadd231pd_avx512f(auVar28,auVar27,auVar29);
            pdVar2 = pdVar21 + uVar23;
            bVar8 = (bool)((byte)(uVar14 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar14 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar14 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar14 >> 5) & 1);
            bVar13 = (bool)((byte)(uVar14 >> 6) & 1);
            *pdVar2 = (double)((ulong)(bVar7 & 1) * auVar28._0_8_ |
                              (ulong)!(bool)(bVar7 & 1) * (long)*pdVar2);
            pdVar2[1] = (double)((ulong)bVar8 * auVar28._8_8_ | (ulong)!bVar8 * (long)pdVar2[1]);
            pdVar2[2] = (double)((ulong)bVar9 * auVar28._16_8_ | (ulong)!bVar9 * (long)pdVar2[2]);
            pdVar2[3] = (double)((ulong)bVar10 * auVar28._24_8_ | (ulong)!bVar10 * (long)pdVar2[3]);
            pdVar2[4] = (double)((ulong)bVar11 * auVar28._32_8_ | (ulong)!bVar11 * (long)pdVar2[4]);
            pdVar2[5] = (double)((ulong)bVar12 * auVar28._40_8_ | (ulong)!bVar12 * (long)pdVar2[5]);
            pdVar2[6] = (double)((ulong)bVar13 * auVar28._48_8_ | (ulong)!bVar13 * (long)pdVar2[6]);
            pdVar2[7] = (double)((uVar14 >> 7) * auVar28._56_8_ |
                                (ulong)!SUB81(uVar14 >> 7,0) * (long)pdVar2[7]);
            uVar23 = uVar23 + 8;
          } while ((uVar4 + 7 & 0xfffffff8) != uVar23);
          uVar24 = uVar24 + 1;
          pdVar21 = pdVar21 + uVar15;
          pfVar19 = pfVar19 + uVar15;
        } while (uVar24 != uVar15);
LAB_0013ae95:
        operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_80 = local_80 + 4;
      local_90 = local_90 + 1;
    } while (local_90 < this->kPatternCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsPartials(const REALTYPE *postOrderPartial,
                                                                  const REALTYPE *preOrderPartial,
                                                                  const double *categoryRates,
                                                                  const REALTYPE *categoryWeights,
                                                                  const double edgeLength,
                                                                  double *outCrossProducts,
                                                                  double *outSumSquaredDerivatives) {

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        std::vector<REALTYPE> tmp(kStateCount * kStateCount, 0.0); // TODO Handle temporary memory better

        REALTYPE patternDenominator = 0.0;

        for (int category = 0; category < kCategoryCount; category++) {

            const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

            const REALTYPE weight = categoryWeights[category];
            const int patternIndex = category * kPatternCount + pattern; // Bad memory access
            const int v = patternIndex * kPartialsPaddedStateCount;

            REALTYPE denominator = 0.0;
            for (int k = 0; k < kStateCount; k++) {
                denominator += postOrderPartial[v + k] * preOrderPartial[v + k];
            }
            patternDenominator += denominator * weight;

            for (int k = 0; k < kStateCount; k++) {
                for (int j = 0; j < kStateCount; j++) {
                    tmp[k * kStateCount + j] += preOrderPartial[v + k] * postOrderPartial[v + j] * weight * scale;
                }
            }
        }

        const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
        for (int k = 0; k < kStateCount; k++) {
            for (int j = 0; j < kStateCount; j++) {
                outCrossProducts[k * kStateCount + j] += tmp[k * kStateCount + j] * patternWeight;
            }
        }
    }
}